

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O1

void __thiscall Generator::generateCode(Generator *this)

{
  bool bVar1;
  QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>
  *pQVar2;
  Data *pDVar3;
  SuperClass *pSVar4;
  qsizetype qVar5;
  Data *pDVar6;
  qsizetype __s2;
  bool bVar7;
  char cVar8;
  bool bVar9;
  int iVar10;
  P _a;
  const_iterator cVar11;
  QFlags<QtMocConstants::EnumFlags> *pQVar12;
  void *pvVar13;
  long lVar14;
  longlong lVar15;
  _Rb_tree_node_base *p_Var16;
  QList<ClassDef::Interface> *pQVar17;
  ClassDef *pCVar18;
  char *pcVar19;
  char *pcVar20;
  char *pcVar21;
  undefined8 *puVar22;
  QByteArray *pQVar23;
  long lVar24;
  long lVar25;
  EnumDef *pEVar26;
  QArrayData *pQVar27;
  long lVar28;
  size_t sVar29;
  ulong uVar30;
  FILE *pFVar31;
  char *b;
  PropertyDef *pPVar32;
  PropertyDef *pPVar33;
  PropertyDef *p;
  PropertyDef *pPVar34;
  QList<ClassDef::Interface> *pQVar35;
  QByteArray *ba;
  long lVar36;
  QByteArray *pQVar37;
  EnumDef *pEVar38;
  char *pcVar39;
  _Rb_tree_node_base *p_Var40;
  long in_FS_OFFSET;
  bool bVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QByteArrayView QVar45;
  QByteArrayView QVar46;
  QByteArrayView QVar47;
  QByteArrayView QVar48;
  char *local_170;
  QArrayData *local_168;
  QStringBuilder<QStringBuilder<QByteArray_&,_const_char_(&)[3]>,_QByteArray_&> local_150;
  QByteArray local_138;
  QMultiHash<QByteArray,_QByteArray> local_118;
  QByteArray qualifiedClassNameIdentifier;
  QByteArray local_e8;
  EnumDef def;
  QStringTokenizerBase<QLatin1String,_QChar> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  def.name.d.d = (Data *)0x1422c5;
  bVar7 = operator==((QByteArray *)this->cdef,(char **)&def);
  pCVar18 = this->cdef;
  lVar14 = (pCVar18->constructorList).d.size;
  local_58.super_QStringTokenizerBaseBase.m_sb.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
  super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
       (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
  local_58.super_QStringTokenizerBaseBase.m_cs = CaseInsensitive;
  local_58.m_haystack.m_size = 0;
  local_58.m_haystack.m_data = (char *)0x0;
  lVar24 = (pCVar18->super_BaseDef).enumList.d.size;
  if (lVar24 != 0) {
    pEVar38 = (pCVar18->super_BaseDef).enumList.d.ptr;
    pEVar26 = pEVar38 + lVar24;
    do {
      def.name.d.d = (pEVar38->name).d.d;
      def.name.d.ptr = (pEVar38->name).d.ptr;
      def.name.d.size = (pEVar38->name).d.size;
      if (def.name.d.d != (Data *)0x0) {
        LOCK();
        ((def.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((def.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      def.enumName.d.d = (pEVar38->enumName).d.d;
      def.enumName.d.ptr = (pEVar38->enumName).d.ptr;
      def.enumName.d.size = (pEVar38->enumName).d.size;
      if (def.enumName.d.d != (Data *)0x0) {
        LOCK();
        ((def.enumName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((def.enumName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      def.type.d.d = (pEVar38->type).d.d;
      def.type.d.ptr = (pEVar38->type).d.ptr;
      def.type.d.size = (pEVar38->type).d.size;
      if (def.type.d.d != (Data *)0x0) {
        LOCK();
        ((def.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((def.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      def.values.d.d = (pEVar38->values).d.d;
      def.values.d.ptr = (pEVar38->values).d.ptr;
      def.values.d.size = (pEVar38->values).d.size;
      if (def.values.d.d != (Data *)0x0) {
        LOCK();
        ((def.values.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((def.values.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      def._100_4_ = 0xaaaaaaaa;
      def.flags.super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
      super_QFlagsStorage<QtMocConstants::EnumFlags>.i =
           (QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>)
           (QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>)
           (pEVar38->flags).super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
           super_QFlagsStorage<QtMocConstants::EnumFlags>.i;
      pCVar18 = this->cdef;
      pQVar2 = (pCVar18->super_BaseDef).enumDeclarations.d.d.ptr;
      if ((pQVar2 != (QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>
                      *)0x0) &&
         (cVar11 = std::
                   _Rb_tree<QByteArray,_std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>,_std::_Select1st<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>
                   ::find(&(pQVar2->m)._M_t,&def.name),
         (_Rb_tree_header *)cVar11._M_node !=
         &(((pCVar18->super_BaseDef).enumDeclarations.d.d.ptr)->m)._M_t._M_impl.
          super__Rb_tree_header)) {
        QtPrivate::QMovableArrayOps<EnumDef>::emplace<EnumDef_const&>
                  ((QMovableArrayOps<EnumDef> *)&local_58,(qsizetype)local_58.m_haystack.m_data,&def
                  );
        QList<EnumDef>::end((QList<EnumDef> *)&local_58);
      }
      QByteArray::operator=(&def.enumName,&def.name);
      local_e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_e8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      qualifiedClassNameIdentifier.d.d = (Data *)0x0;
      qualifiedClassNameIdentifier.d.ptr = (char *)0x0;
      qualifiedClassNameIdentifier.d.size = 0;
      QMap<QByteArray,_QByteArray>::value
                (&local_e8,&(this->cdef->super_BaseDef).flagAliases,&def.name,
                 &qualifiedClassNameIdentifier);
      if (qualifiedClassNameIdentifier.d.d != (Data *)0x0) {
        LOCK();
        ((qualifiedClassNameIdentifier.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((qualifiedClassNameIdentifier.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((qualifiedClassNameIdentifier.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(qualifiedClassNameIdentifier.d.d)->super_QArrayData,1,0x10);
        }
      }
      pCVar18 = this->cdef;
      pQVar2 = (pCVar18->super_BaseDef).enumDeclarations.d.d.ptr;
      if ((pQVar2 != (QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>
                      *)0x0) &&
         (cVar11 = std::
                   _Rb_tree<QByteArray,_std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>,_std::_Select1st<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>
                   ::find(&(pQVar2->m)._M_t,&local_e8),
         (_Rb_tree_header *)cVar11._M_node !=
         &(((pCVar18->super_BaseDef).enumDeclarations.d.d.ptr)->m)._M_t._M_impl.
          super__Rb_tree_header)) {
        QByteArray::operator=(&def.name,&local_e8);
        pQVar12 = QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_>::operator[]
                            (&(this->cdef->super_BaseDef).enumDeclarations,&local_e8);
        def.flags.super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
        super_QFlagsStorage<QtMocConstants::EnumFlags>.i =
             (QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>)
             (QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>)
             ((uint)def.flags.super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
                    super_QFlagsStorage<QtMocConstants::EnumFlags>.i |
             (pQVar12->super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>).
             super_QFlagsStorage<QtMocConstants::EnumFlags>.i);
        QtPrivate::QMovableArrayOps<EnumDef>::emplace<EnumDef_const&>
                  ((QMovableArrayOps<EnumDef> *)&local_58,(qsizetype)local_58.m_haystack.m_data,&def
                  );
        QList<EnumDef>::end((QList<EnumDef> *)&local_58);
      }
      if ((QStringTokenizerBaseBase)local_e8.d.d != (QStringTokenizerBaseBase)0x0) {
        LOCK();
        *(int *)local_e8.d.d = *(int *)local_e8.d.d + -1;
        UNLOCK();
        if (*(int *)local_e8.d.d == 0) {
          QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,1,0x10);
        }
      }
      QArrayDataPointer<QByteArray>::~QArrayDataPointer(&def.values.d);
      if (def.type.d.d != (Data *)0x0) {
        LOCK();
        ((def.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((def.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((def.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(def.type.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (def.enumName.d.d != (Data *)0x0) {
        LOCK();
        ((def.enumName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((def.enumName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
        ;
        UNLOCK();
        if (((def.enumName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate(&(def.enumName.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (def.name.d.d != (Data *)0x0) {
        LOCK();
        ((def.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((def.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((def.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(def.name.d.d)->super_QArrayData,1,0x10);
        }
      }
      pEVar38 = pEVar38 + 1;
    } while (pEVar38 != pEVar26);
  }
  QArrayDataPointer<EnumDef>::operator=
            (&(this->cdef->super_BaseDef).enumList.d,(QArrayDataPointer<EnumDef> *)&local_58);
  QArrayDataPointer<EnumDef>::~QArrayDataPointer((QArrayDataPointer<EnumDef> *)&local_58);
  strreg(this,&(this->cdef->super_BaseDef).qualified);
  registerClassInfoStrings(this);
  registerFunctionStrings(this,&this->cdef->signalList);
  registerFunctionStrings(this,&this->cdef->slotList);
  registerFunctionStrings(this,&this->cdef->methodList);
  registerFunctionStrings(this,&this->cdef->constructorList);
  lVar24 = (this->cdef->nonClassSignalList).d.size;
  if (lVar24 != 0) {
    pQVar23 = (this->cdef->nonClassSignalList).d.ptr;
    lVar24 = lVar24 * 0x18;
    do {
      strreg(this,pQVar23);
      pQVar23 = pQVar23 + 1;
      lVar24 = lVar24 + -0x18;
    } while (lVar24 != 0);
  }
  registerPropertyStrings(this);
  registerEnumStrings(this);
  cVar8 = '\x01';
  if (this->requireCompleteTypes == false) {
    cVar8 = this->cdef->requireCompleteMethodTypes;
  }
  pCVar18 = this->cdef;
  if (((pCVar18->hasQObject == false) && ((pCVar18->methodList).d.size == 0)) &&
     ((pCVar18->propertyList).d.size == 0)) {
    bVar41 = (pCVar18->constructorList).d.size == 0;
  }
  else {
    bVar41 = false;
  }
  bVar1 = (this->parser->super_Parser).activeQtMode;
  qualifiedClassNameIdentifier.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  qualifiedClassNameIdentifier.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  qualifiedClassNameIdentifier.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(&qualifiedClassNameIdentifier,"ZN",-1);
  local_58.m_haystack.m_data = (pCVar18->super_BaseDef).qualified.d.ptr;
  local_58.m_haystack.m_size = (pCVar18->super_BaseDef).qualified.d.size;
  local_58.super_QStringTokenizerBaseBase.m_sb.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
  super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
       (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x1;
  local_58.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
  local_58.m_needle.ucs = L':';
  def.type.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  def.enumName.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  def.enumName.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  def.name.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  def.enumName.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  def.name.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  def.name.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QStringTokenizerBase<QLatin1String,_QChar>::iterator::iterator((iterator *)&def,&local_58);
  if ((char)def.enumName.d.d == '\x01') {
    do {
      pcVar39 = def.name.d.ptr;
      QByteArray::number((longlong)&local_e8,(int)def.name.d.ptr);
      QByteArray::append(&qualifiedClassNameIdentifier);
      if ((QStringTokenizerBaseBase)local_e8.d.d != (QStringTokenizerBaseBase)0x0) {
        LOCK();
        *(int *)local_e8.d.d = *(int *)local_e8.d.d + -1;
        UNLOCK();
        if (*(int *)local_e8.d.d == 0) {
          QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,1,0x10);
        }
      }
      QVar42.m_data = pcVar39;
      QVar42.m_size = qualifiedClassNameIdentifier.d.size;
      QByteArray::insert((longlong)&qualifiedClassNameIdentifier,QVar42);
      QStringTokenizerBase<QLatin1String,_QChar>::iterator::advance((iterator *)&def);
    } while ((char)def.enumName.d.d != '\0');
  }
  QByteArray::append((char)&qualifiedClassNameIdentifier);
  pCVar18 = this->cdef;
  if (pCVar18->hasQNamespace == false) {
    pDVar3 = (pCVar18->super_BaseDef).classname.d.d;
    if ((pDVar3 == (Data *)0x0) || (1 < (int)(pDVar3->super_QArrayData).ref_._q_value)) {
      QByteArray::reallocData
                ((longlong)pCVar18,(AllocationOption)(pCVar18->super_BaseDef).classname.d.size);
    }
    pcVar39 = (pCVar18->super_BaseDef).classname.d.ptr;
  }
  else {
    pcVar39 = anon_var_dwarf_3fa62;
  }
  pcVar21 = qualifiedClassNameIdentifier.d.ptr;
  if (qualifiedClassNameIdentifier.d.ptr == (char *)0x0) {
    pcVar21 = (char *)&QByteArray::_empty;
  }
  fprintf((FILE *)this->out,"namespace {\nstruct qt_meta_tag_%s_t {};\n} // unnamed namespace\n\n",
          pcVar21);
  pcVar21 = (this->cdef->super_BaseDef).qualified.d.ptr;
  if (pcVar21 == (char *)0x0) {
    pcVar21 = (char *)&QByteArray::_empty;
  }
  pcVar19 = qualifiedClassNameIdentifier.d.ptr;
  if (qualifiedClassNameIdentifier.d.ptr == (char *)0x0) {
    pcVar19 = (char *)&QByteArray::_empty;
  }
  fprintf((FILE *)this->out,
          "template <> constexpr inline auto %s::qt_create_metaobjectdata<qt_meta_tag_%s_t>()\n{\n    namespace QMC = QtMocConstants;\n"
          ,pcVar21,pcVar19);
  fwrite("    QtMocHelpers::StringRefStorage qt_stringData {",0x32,1,(FILE *)this->out);
  addStrings(this,&this->strings);
  fwrite("\n    };\n\n",9,1,(FILE *)this->out);
  fwrite("    QtMocHelpers::UintData qt_methods {\n",0x28,1,(FILE *)this->out);
  addFunctions(this,&this->cdef->signalList,"Signal");
  addFunctions(this,&this->cdef->slotList,"Slot");
  addFunctions(this,&this->cdef->methodList,"Method");
  fwrite("    };\n    QtMocHelpers::UintData qt_properties {\n",0x32,1,(FILE *)this->out);
  addProperties(this);
  fwrite("    };\n    QtMocHelpers::UintData qt_enums {\n",0x2d,1,(FILE *)this->out);
  addEnums(this);
  fwrite("    };\n",7,1,(FILE *)this->out);
  if (lVar14 == 0) {
    if ((this->cdef->super_BaseDef).classInfoList.d.size != 0) {
      fputs("    QtMocHelpers::UintData qt_constructors {};\n",(FILE *)this->out);
      goto LAB_0010879a;
    }
    pcVar21 = "";
  }
  else {
    fwrite("    using Constructor = QtMocHelpers::NoType;\n    QtMocHelpers::UintData qt_constructors {\n"
           ,0x5b,1,(FILE *)this->out);
    addFunctions(this,&this->cdef->constructorList,"Constructor");
    fwrite("    };\n",7,1,(FILE *)this->out);
LAB_0010879a:
    if ((this->cdef->super_BaseDef).classInfoList.d.size == 0) {
      pcVar21 = ", qt_constructors";
    }
    else {
      fwrite("    QtMocHelpers::ClassInfos qt_classinfo({\n",0x2c,1,(FILE *)this->out);
      addClassInfos(this);
      fwrite("    });\n",8,1,(FILE *)this->out);
      pcVar21 = ", qt_constructors, qt_classinfo";
    }
  }
  if ((this->cdef->hasQGadget == false) && (this->cdef->hasQNamespace != true)) {
    pcVar19 = "QMC::MetaObjectFlag{}";
  }
  else {
    pcVar19 = "QMC::PropertyAccessInStaticMetaCall";
  }
  if (cVar8 == '\0') {
    local_58.super_QStringTokenizerBaseBase = (QStringTokenizerBaseBase)((long)"<qt_meta_tag_" + 1);
    local_58.m_haystack.m_size = (qsizetype)&qualifiedClassNameIdentifier;
    local_58.m_haystack.m_data = "_t";
    QStringBuilder<QStringBuilder<const_char_(&)[13],_const_QByteArray_&>,_const_char_(&)[3]>::
    convertTo<QByteArray>
              (&def.name,
               (QStringBuilder<QStringBuilder<const_char_(&)[13],_const_QByteArray_&>,_const_char_(&)[3]>
                *)&local_58);
    pQVar27 = &(def.name.d.d)->super_QArrayData;
    def.name.d.d = (Data *)0x0;
    pcVar20 = def.name.d.ptr;
  }
  else {
    pQVar27 = (QArrayData *)0x0;
    pcVar20 = anon_var_dwarf_3fa62;
  }
  if (pcVar20 == (char *)0x0) {
    pcVar20 = (char *)&QByteArray::_empty;
  }
  fprintf((FILE *)this->out,
          "    return QtMocHelpers::metaObjectData<%s, %s>(%s, qt_stringData,\n            qt_methods, qt_properties, qt_enums%s);\n}\n"
          ,pcVar39,pcVar20,pcVar19,pcVar21);
  if (pQVar27 != (QArrayData *)0x0) {
    LOCK();
    (pQVar27->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar27->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar27->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar27,1,0x10);
    }
  }
  if (this->cdef->hasQNamespace == true) {
    local_58.super_QStringTokenizerBaseBase.m_sb.
    super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.super_QFlagsStorage<Qt::SplitBehaviorFlags>
    .i._0_1_ = 0x5f;
    local_58.m_haystack.m_size = (qsizetype)&qualifiedClassNameIdentifier;
    QStringBuilder<char,_const_QByteArray_&>::convertTo<QByteArray>
              (&def.name,(QStringBuilder<char,_const_QByteArray_&> *)&local_58);
    local_168 = &(def.name.d.d)->super_QArrayData;
    local_170 = def.name.d.ptr;
    pcVar39 = def.name.d.ptr;
    if (def.name.d.ptr == (char *)0x0) {
      pcVar39 = (char *)&QByteArray::_empty;
    }
    pcVar21 = (this->cdef->super_BaseDef).qualified.d.ptr;
    if (pcVar21 == (char *)0x0) {
      pcVar21 = (char *)&QByteArray::_empty;
    }
    fprintf((FILE *)this->out,
            "\nstatic constexpr auto qt_staticMetaObjectContent%s =\n    %s::qt_create_metaobjectdata<qt_meta_tag%s_t>();\nstatic constexpr auto qt_staticMetaObjectStaticContent%s =\n    qt_staticMetaObjectContent%s.staticData;\nstatic constexpr auto qt_staticMetaObjectRelocatingContent%s =\n    qt_staticMetaObjectContent%s.relocatingData;\n\n"
            ,pcVar39,pcVar21,pcVar39,pcVar39,pcVar39,pcVar39,pcVar39);
  }
  else {
    local_58.super_QStringTokenizerBaseBase = (QStringTokenizerBaseBase)0x13f805;
    local_58.m_haystack.m_size = (qsizetype)&qualifiedClassNameIdentifier;
    local_58.m_haystack.m_data = "_t>";
    QStringBuilder<QStringBuilder<const_char_(&)[14],_const_QByteArray_&>,_const_char_(&)[4]>::
    convertTo<QByteArray>
              (&def.name,
               (QStringBuilder<QStringBuilder<const_char_(&)[14],_const_QByteArray_&>,_const_char_(&)[4]>
                *)&local_58);
    local_168 = &(def.name.d.d)->super_QArrayData;
    local_170 = def.name.d.ptr;
  }
  def.name.d.d = (Data *)0x0;
  def.name.d.ptr = (char *)0x0;
  def.name.d.size = 0;
  local_118.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_118.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QMultiHash<QByteArray,_QByteArray>::QMultiHash(&local_118,&this->knownGadgets);
  QMultiHash<QByteArray,_QByteArray>::unite(&local_118,&this->knownQObjectClasses);
  lVar14 = (this->cdef->propertyList).d.size;
  if (lVar14 != 0) {
    pPVar34 = (this->cdef->propertyList).d.ptr;
    pPVar32 = pPVar34 + lVar14;
    do {
      bVar9 = isBuiltinType(&pPVar34->type);
      if (!bVar9) {
        pcVar39 = (pPVar34->type).d.ptr;
        sVar29 = (pPVar34->type).d.size;
        if ((sVar29 == 0) || (pvVar13 = memchr(pcVar39,0x2a,sVar29), pvVar13 == (void *)0x0)) {
          lVar14 = -1;
        }
        else {
          lVar14 = (long)pvVar13 - (long)pcVar39;
        }
        if (lVar14 == -1) {
          if ((sVar29 == 0) || (pvVar13 = memchr(pcVar39,0x3c,sVar29), pvVar13 == (void *)0x0)) {
            lVar14 = -1;
          }
          else {
            lVar14 = (long)pvVar13 - (long)pcVar39;
          }
          if (lVar14 == -1) {
            if ((sVar29 == 0) || (pvVar13 = memchr(pcVar39,0x3e,sVar29), pvVar13 == (void *)0x0)) {
              lVar14 = -1;
            }
            else {
              lVar14 = (long)pvVar13 - (long)pcVar39;
            }
            if ((lVar14 == -1) &&
               (QVar43.m_data = pcVar39, QVar43.m_size = sVar29, QVar46.m_data = "::",
               QVar46.m_size = 2, lVar14 = QtPrivate::lastIndexOf(QVar43,sVar29,QVar46), 0 < lVar14)
               ) {
              local_58.m_haystack.m_data = &DAT_aaaaaaaaaaaaaaaa;
              local_58.super_QStringTokenizerBaseBase =
                   (QStringTokenizerBaseBase)&DAT_aaaaaaaaaaaaaaaa;
              local_58.m_haystack.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              QByteArray::left((QByteArray *)&local_58,&pPVar34->type,lVar14);
              pCVar18 = this->cdef;
              local_e8.d.d = (pCVar18->super_BaseDef).qualified.d.d;
              local_e8.d.ptr = (pCVar18->super_BaseDef).qualified.d.ptr;
              local_e8.d.size = (pCVar18->super_BaseDef).qualified.d.size;
              if ((QStringTokenizerBaseBase)local_e8.d.d != (QStringTokenizerBaseBase)0x0) {
                LOCK();
                *(int *)local_e8.d.d = *(int *)local_e8.d.d + 1;
                UNLOCK();
              }
              do {
                qVar5 = local_e8.d.size;
                pcVar39 = local_e8.d.ptr;
                QVar44.m_data = local_e8.d.ptr;
                QVar44.m_size = local_e8.d.size;
                QVar47.m_data = "::";
                QVar47.m_size = 2;
                lVar15 = QtPrivate::lastIndexOf(QVar44,local_e8.d.size,QVar47);
                if (lVar15 < qVar5) {
                  if (lVar15 < 1) {
                    lVar15 = 0;
                  }
                  QByteArray::QByteArray(&local_138,pcVar39,lVar15);
                }
                else {
                  local_138.d.d = local_e8.d.d;
                  local_138.d.ptr = pcVar39;
                  local_138.d.size = qVar5;
                  if ((QStringTokenizerBaseBase)local_e8.d.d != (QStringTokenizerBaseBase)0x0) {
                    LOCK();
                    *(int *)local_e8.d.d = *(int *)local_e8.d.d + 1;
                    UNLOCK();
                  }
                }
                pcVar39 = local_e8.d.ptr;
                pDVar6 = local_e8.d.d;
                qVar5 = local_138.d.size;
                pDVar3 = local_138.d.d;
                local_138.d.d = local_e8.d.d;
                local_e8.d.d = pDVar3;
                local_e8.d.ptr = local_138.d.ptr;
                local_138.d.ptr = pcVar39;
                local_138.d.size = local_e8.d.size;
                local_e8.d.size = qVar5;
                if ((QStringTokenizerBaseBase)pDVar6 != (QStringTokenizerBaseBase)0x0) {
                  LOCK();
                  *(int *)pDVar6 = *(int *)pDVar6 + -1;
                  UNLOCK();
                  if (*(int *)pDVar6 == 0) {
                    QArrayData::deallocate(&pDVar6->super_QArrayData,1,0x10);
                  }
                }
                local_138.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_138.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_138.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
                if ((char *)local_e8.d.size == (char *)0x0) {
                  local_138.d.d = (Data *)local_58.super_QStringTokenizerBaseBase;
                  local_138.d.ptr = (char *)local_58.m_haystack.m_size;
                  local_138.d.size = (qsizetype)local_58.m_haystack.m_data;
                  if (local_58.super_QStringTokenizerBaseBase != (QStringTokenizerBaseBase)0x0) {
                    LOCK();
                    *(int *)local_58.super_QStringTokenizerBaseBase =
                         *(int *)local_58.super_QStringTokenizerBaseBase + 1;
                    UNLOCK();
                  }
                }
                else {
                  local_150.a.a = &local_e8;
                  local_150.a.b = (char (*) [3])0x13f817;
                  local_150.b = (QByteArray *)&local_58;
                  QStringBuilder<QStringBuilder<QByteArray_&,_const_char_(&)[3]>,_QByteArray_&>::
                  convertTo<QByteArray>(&local_138,&local_150);
                }
                QMultiHash<QByteArray,_QByteArray>::constFindImpl<QByteArray>
                          ((const_iterator *)&local_150,&local_118,&local_138);
                pQVar23 = local_150.b;
                if ((QStringTokenizerBaseBase)local_138.d.d != (QStringTokenizerBaseBase)0x0) {
                  LOCK();
                  *(int *)local_138.d.d = *(int *)local_138.d.d + -1;
                  UNLOCK();
                  if (*(int *)local_138.d.d == 0) {
                    QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,1,0x10);
                  }
                }
                if ((char *)local_e8.d.size == (char *)0x0) {
                  if ((QStringTokenizerBase<QLatin1String,_QChar> *)pQVar23 ==
                      (QStringTokenizerBase<QLatin1String,_QChar> *)0x0) goto LAB_00108dbe;
                  break;
                }
              } while ((QStringTokenizerBase<QLatin1String,_QChar> *)pQVar23 ==
                       (QStringTokenizerBase<QLatin1String,_QChar> *)0x0);
              pQVar23 = (QByteArray *)(pQVar23->d).d;
              local_138.d.d = (Data *)0x13f81a;
              bVar9 = operator==(pQVar23,(char **)&local_138);
              if ((!bVar9) &&
                 (bVar9 = qualifiedNameEquals(&(this->cdef->super_BaseDef).qualified,pQVar23),
                 !bVar9)) {
                if (def.name.d.size == 0) {
LAB_00108d8e:
                  lVar24 = -1;
                }
                else {
                  lVar24 = 0x18 - (long)def.name.d.ptr;
                  lVar14 = def.name.d.size * 0x18;
                  pQVar37 = (QByteArray *)def.name.d.ptr;
                  do {
                    lVar28 = lVar14;
                    if (lVar28 == 0) goto LAB_00108d89;
                    bVar9 = operator==(pQVar37,pQVar23);
                    lVar24 = lVar24 + -0x18;
                    pQVar37 = pQVar37 + 1;
                    lVar14 = lVar28 + -0x18;
                  } while (!bVar9);
                  lVar24 = (-(long)(def.name.d.ptr + lVar24) >> 3) * -0x5555555555555555;
LAB_00108d89:
                  if (lVar28 == 0) goto LAB_00108d8e;
                }
                if (lVar24 == -1) {
                  QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray_const&>
                            ((QMovableArrayOps<QByteArray> *)&def,def.name.d.size,pQVar23);
                  QList<QByteArray>::end((QList<QByteArray> *)&def);
                }
              }
LAB_00108dbe:
              if ((QStringTokenizerBaseBase)local_e8.d.d != (QStringTokenizerBaseBase)0x0) {
                LOCK();
                *(int *)local_e8.d.d = *(int *)local_e8.d.d + -1;
                UNLOCK();
                if (*(int *)local_e8.d.d == 0) {
                  QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,1,0x10);
                }
              }
              if (local_58.super_QStringTokenizerBaseBase != (QStringTokenizerBaseBase)0x0) {
                LOCK();
                *(int *)local_58.super_QStringTokenizerBaseBase =
                     *(int *)local_58.super_QStringTokenizerBaseBase + -1;
                UNLOCK();
                if (*(int *)local_58.super_QStringTokenizerBaseBase == 0) {
                  QArrayData::deallocate
                            ((QArrayData *)local_58.super_QStringTokenizerBaseBase,1,0x10);
                }
              }
            }
          }
        }
      }
      pPVar34 = pPVar34 + 1;
    } while (pPVar34 != pPVar32);
  }
  pQVar2 = (this->cdef->super_BaseDef).enumDeclarations.d.d.ptr;
  if (pQVar2 == (QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>
                 *)0x0) {
    p_Var16 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var16 = *(_Base_ptr *)((long)&(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10)
    ;
  }
  p_Var40 = &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar2 == (QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>
                 *)0x0) {
    p_Var40 = (_Rb_tree_node_base *)0x0;
  }
  for (; p_Var16 != p_Var40; p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
    QVar45.m_data = (storage_type *)p_Var16[1]._M_parent;
    QVar45.m_size = (qsizetype)p_Var16[1]._M_left;
    QVar48.m_data = "::";
    QVar48.m_size = 2;
    lVar14 = QtPrivate::lastIndexOf(QVar45,(longlong)p_Var16[1]._M_left,QVar48);
    if (0 < lVar14) {
      local_58.m_haystack.m_data = &DAT_aaaaaaaaaaaaaaaa;
      local_58.super_QStringTokenizerBaseBase = (QStringTokenizerBaseBase)&DAT_aaaaaaaaaaaaaaaa;
      local_58.m_haystack.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QByteArray::left((QByteArray *)&local_58,(QByteArray *)(p_Var16 + 1),lVar14);
      local_e8.d.d = (Data *)0x13f81a;
      bVar9 = operator!=((QByteArray *)&local_58,(char **)&local_e8);
      if ((bVar9) &&
         (bVar9 = qualifiedNameEquals(&(this->cdef->super_BaseDef).qualified,(QByteArray *)&local_58
                                     ), pcVar21 = local_58.m_haystack.m_data,
         __s2 = local_58.m_haystack.m_size, qVar5 = def.name.d.size, pcVar39 = def.name.d.ptr,
         !bVar9)) {
        if (def.name.d.size == 0) {
LAB_00108fa8:
          lVar24 = -1;
        }
        else {
          lVar14 = def.name.d.size * 0x18;
          lVar28 = 0;
          lVar24 = 0;
          bVar9 = false;
          do {
            pcVar19 = *(char **)(pcVar39 + lVar28 + 0x10);
            if ((pcVar19 == pcVar21) &&
               ((pcVar19 == (char *)0x0 ||
                (iVar10 = bcmp(*(void **)(pcVar39 + lVar28 + 8),(void *)__s2,(size_t)pcVar19),
                iVar10 == 0)))) break;
            lVar24 = lVar24 + 1;
            lVar28 = lVar28 + 0x18;
            bVar9 = lVar14 == lVar28;
          } while (!bVar9);
          if (bVar9) goto LAB_00108fa8;
        }
        if (lVar24 == -1) {
          QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray_const&>
                    ((QMovableArrayOps<QByteArray> *)&def,qVar5,(QByteArray *)&local_58);
          QList<QByteArray>::end((QList<QByteArray> *)&def);
        }
      }
      if (local_58.super_QStringTokenizerBaseBase != (QStringTokenizerBaseBase)0x0) {
        LOCK();
        *(int *)local_58.super_QStringTokenizerBaseBase =
             *(int *)local_58.super_QStringTokenizerBaseBase + -1;
        UNLOCK();
        if (*(int *)local_58.super_QStringTokenizerBaseBase == 0) {
          QArrayData::deallocate((QArrayData *)local_58.super_QStringTokenizerBaseBase,1,0x10);
        }
      }
    }
  }
  if (def.name.d.size != 0) {
    pcVar39 = qualifiedClassNameIdentifier.d.ptr;
    if (qualifiedClassNameIdentifier.d.ptr == (char *)0x0) {
      pcVar39 = (char *)&QByteArray::_empty;
    }
    fprintf((FILE *)this->out,
            "Q_CONSTINIT static const QMetaObject::SuperData qt_meta_extradata_%s[] = {\n",pcVar39);
    pcVar39 = def.name.d.ptr;
    if (def.name.d.size != 0) {
      lVar14 = def.name.d.size * 0x18;
      lVar24 = 0;
      do {
        puVar22 = *(undefined8 **)(pcVar39 + lVar24 + 8);
        if (puVar22 == (undefined8 *)0x0) {
          puVar22 = &QByteArray::_empty;
        }
        fprintf((FILE *)this->out,"    QMetaObject::SuperData::link<%s::staticMetaObject>(),\n",
                puVar22);
        lVar24 = lVar24 + 0x18;
      } while (lVar14 != lVar24);
    }
    fwrite("    nullptr\n};\n\n",0x10,1,(FILE *)this->out);
  }
  pcVar39 = (this->cdef->super_BaseDef).qualified.d.ptr;
  if (pcVar39 == (char *)0x0) {
    pcVar39 = (char *)&QByteArray::_empty;
  }
  fprintf((FILE *)this->out,"Q_CONSTINIT const QMetaObject %s::staticMetaObject = { {\n",pcVar39);
  if (!bVar7) {
    pCVar18 = this->cdef;
    lVar14 = (pCVar18->superclassList).d.size;
    if (lVar14 != 0) {
      if ((pCVar18->hasQGadget == false) && (pCVar18->hasQNamespace == false)) {
        pFVar31 = (FILE *)this->out;
        pcVar39 = (this->purestSuperClass).d.ptr;
        if (pcVar39 == (char *)0x0) {
          pcVar39 = (char *)&QByteArray::_empty;
        }
        pcVar21 = "    QMetaObject::SuperData::link<%s::staticMetaObject>(),\n";
      }
      else {
        if (lVar14 == 0) goto LAB_0010913b;
        pFVar31 = (FILE *)this->out;
        pcVar39 = (this->purestSuperClass).d.ptr;
        if (pcVar39 == (char *)0x0) {
          pcVar39 = (char *)&QByteArray::_empty;
        }
        pcVar21 = "    QtPrivate::MetaObjectForType<%s>::value,\n";
      }
      fprintf(pFVar31,pcVar21,pcVar39);
      goto LAB_00109179;
    }
  }
LAB_0010913b:
  fwrite("    nullptr,\n",0xd,1,(FILE *)this->out);
LAB_00109179:
  if (local_170 == (char *)0x0) {
    local_170 = (char *)&QByteArray::_empty;
  }
  fprintf((FILE *)this->out,
          "    qt_staticMetaObjectStaticContent%s.stringdata,\n    qt_staticMetaObjectStaticContent%s.data,\n"
          ,local_170,local_170);
  if (bVar41 || bVar1 != false) {
    pcVar39 = "    nullptr,\n";
    sVar29 = 0xd;
  }
  else {
    pcVar39 = "    qt_static_metacall,\n";
    sVar29 = 0x18;
  }
  fwrite(pcVar39,sVar29,1,(FILE *)this->out);
  if (def.name.d.size == 0) {
    fwrite("    nullptr,\n",0xd,1,(FILE *)this->out);
  }
  else {
    pcVar39 = qualifiedClassNameIdentifier.d.ptr;
    if (qualifiedClassNameIdentifier.d.ptr == (char *)0x0) {
      pcVar39 = (char *)&QByteArray::_empty;
    }
    fprintf((FILE *)this->out,"    qt_meta_extradata_%s,\n",pcVar39);
  }
  fprintf((FILE *)this->out,"    qt_staticMetaObjectRelocatingContent%s.metaTypes,\n",local_170);
  fwrite("    nullptr\n} };\n\n",0x12,1,(FILE *)this->out);
  if (!bVar41 && bVar1 == false) {
    generateStaticMetacall(this);
  }
  if (this->cdef->hasQObject == true) {
    pcVar39 = (this->cdef->super_BaseDef).qualified.d.ptr;
    if (pcVar39 == (char *)0x0) {
      pcVar39 = (char *)&QByteArray::_empty;
    }
    fprintf((FILE *)this->out,
            "\nconst QMetaObject *%s::metaObject() const\n{\n    return QObject::d_ptr->metaObject ? QObject::d_ptr->dynamicMetaObject() : &staticMetaObject;\n}\n"
            ,pcVar39);
    pcVar39 = (this->cdef->super_BaseDef).qualified.d.ptr;
    if (pcVar39 == (char *)0x0) {
      pcVar39 = (char *)&QByteArray::_empty;
    }
    fprintf((FILE *)this->out,"\nvoid *%s::qt_metacast(const char *_clname)\n{\n",pcVar39);
    fwrite("    if (!_clname) return nullptr;\n",0x22,1,(FILE *)this->out);
    pcVar39 = qualifiedClassNameIdentifier.d.ptr;
    if (qualifiedClassNameIdentifier.d.ptr == (char *)0x0) {
      pcVar39 = (char *)&QByteArray::_empty;
    }
    fprintf((FILE *)this->out,
            "    if (!strcmp(_clname, qt_staticMetaObjectStaticContent<qt_meta_tag_%s_t>.strings))\n        return static_cast<void*>(this);\n"
            ,pcVar39);
    uVar30 = (this->cdef->superclassList).d.size;
    if (1 < uVar30) {
      pSVar4 = (this->cdef->superclassList).d.ptr;
      lVar14 = 0;
      do {
        if (*(int *)((long)&pSVar4[1].access + lVar14) != 0) {
          puVar22 = *(undefined8 **)((long)&pSVar4[1].classname.d.ptr + lVar14);
          if (puVar22 == (undefined8 *)0x0) {
            puVar22 = &QByteArray::_empty;
          }
          fprintf((FILE *)this->out,
                  "    if (!strcmp(_clname, \"%s\"))\n        return static_cast< %s*>(this);\n",
                  puVar22);
        }
        lVar14 = lVar14 + 0x38;
      } while (uVar30 * 0x38 + -0x38 != lVar14);
    }
    lVar14 = (this->cdef->interfaceList).d.size;
    if (lVar14 != 0) {
      pQVar35 = (this->cdef->interfaceList).d.ptr;
      pQVar17 = pQVar35 + lVar14;
      do {
        if ((pQVar35->d).size != 0) {
          lVar14 = 1;
          lVar24 = 8;
          uVar30 = 0;
          do {
            pcVar39 = (pQVar35->d).ptr[uVar30].interfaceId.d.ptr;
            if (pcVar39 == (char *)0x0) {
              pcVar39 = (char *)&QByteArray::_empty;
            }
            fprintf((FILE *)this->out,"    if (!strcmp(_clname, %s))\n        return ",pcVar39);
            lVar28 = lVar14;
            lVar36 = lVar24;
            do {
              puVar22 = *(undefined8 **)((long)&(((pQVar35->d).ptr)->className).d.d + lVar36);
              if (puVar22 == (undefined8 *)0x0) {
                puVar22 = &QByteArray::_empty;
              }
              fprintf((FILE *)this->out,"static_cast< %s*>(",puVar22);
              lVar36 = lVar36 + -0x30;
              lVar25 = lVar28 + -1;
              bVar41 = 0 < lVar28;
              lVar28 = lVar25;
            } while (lVar25 != 0 && bVar41);
            pFVar31 = (FILE *)this->out;
            uVar30 = uVar30 + 1;
            QByteArray::QByteArray((QByteArray *)&local_58,uVar30,')');
            pQVar23 = (QByteArray *)local_58.m_haystack.m_size;
            if ((QByteArray *)local_58.m_haystack.m_size == (QByteArray *)0x0) {
              pQVar23 = (QByteArray *)&QByteArray::_empty;
            }
            fprintf(pFVar31,"this%s;\n",pQVar23);
            if (local_58.super_QStringTokenizerBaseBase != (QStringTokenizerBaseBase)0x0) {
              LOCK();
              *(int *)local_58.super_QStringTokenizerBaseBase =
                   *(int *)local_58.super_QStringTokenizerBaseBase + -1;
              UNLOCK();
              if (*(int *)local_58.super_QStringTokenizerBaseBase == 0) {
                QArrayData::deallocate((QArrayData *)local_58.super_QStringTokenizerBaseBase,1,0x10)
                ;
              }
            }
            lVar14 = lVar14 + 1;
            lVar24 = lVar24 + 0x30;
          } while (uVar30 < (ulong)(pQVar35->d).size);
        }
        pQVar35 = pQVar35 + 1;
      } while (pQVar35 != pQVar17);
    }
    if (bVar7 || (this->purestSuperClass).d.size == 0) {
      fwrite("    return nullptr;\n",0x14,1,(FILE *)this->out);
    }
    else {
      pQVar27 = &((this->purestSuperClass).d.d)->super_QArrayData;
      pcVar39 = (this->purestSuperClass).d.ptr;
      if (pQVar27 == (QArrayData *)0x0) {
        if (pcVar39 == (char *)0x0) {
          pcVar39 = (char *)&QByteArray::_empty;
        }
        fprintf((FILE *)this->out,"    return %s::qt_metacast(_clname);\n",pcVar39);
      }
      else {
        LOCK();
        (pQVar27->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar27->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        if (pcVar39 == (char *)0x0) {
          pcVar39 = (char *)&QByteArray::_empty;
        }
        fprintf((FILE *)this->out,"    return %s::qt_metacast(_clname);\n",pcVar39);
        LOCK();
        (pQVar27->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar27->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar27->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar27,1,0x10);
        }
      }
    }
    fwrite("}\n",2,1,(FILE *)this->out);
    if ((this->parser->super_Parser).activeQtMode == false) {
      generateMetacall(this);
      pCVar18 = this->cdef;
      if (0 < (int)(pCVar18->signalList).d.size) {
        lVar14 = 0;
        lVar24 = 0;
        do {
          generateSignal(this,(FunctionDef *)
                              ((long)&(((pCVar18->signalList).d.ptr)->type).name.d.d + lVar14),
                         (int)lVar24);
          lVar24 = lVar24 + 1;
          pCVar18 = this->cdef;
          lVar14 = lVar14 + 0xd0;
        } while (lVar24 < (int)(pCVar18->signalList).d.size);
      }
      generatePluginMetaData(this);
      if ((this->cdef->nonClassSignalList).d.size != 0) {
        pcVar39 = qualifiedClassNameIdentifier.d.ptr;
        if (qualifiedClassNameIdentifier.d.ptr == (char *)0x0) {
          pcVar39 = (char *)&QByteArray::_empty;
        }
        fprintf((FILE *)this->out,"namespace CheckNotifySignalValidity_%s {\n",pcVar39);
        lVar14 = (this->cdef->nonClassSignalList).d.size;
        if (lVar14 != 0) {
          pQVar37 = (this->cdef->nonClassSignalList).d.ptr;
          pQVar23 = pQVar37 + lVar14;
          do {
            pPVar34 = (this->cdef->propertyList).d.ptr;
            lVar14 = (this->cdef->propertyList).d.size;
            lVar24 = lVar14 >> 2;
            pPVar32 = pPVar34;
            if (0 < lVar24) {
              lVar24 = lVar24 + 1;
              do {
                bVar7 = operator==(pQVar37,&pPVar32->notify);
                pPVar33 = pPVar32;
                if (bVar7) goto LAB_00109760;
                bVar7 = operator==(pQVar37,&pPVar32[1].notify);
                if (bVar7) {
                  pPVar33 = pPVar32 + 1;
                  goto LAB_00109760;
                }
                bVar7 = operator==(pQVar37,&pPVar32[2].notify);
                if (bVar7) {
                  pPVar33 = pPVar32 + 2;
                  goto LAB_00109760;
                }
                bVar7 = operator==(pQVar37,&pPVar32[3].notify);
                if (bVar7) {
                  pPVar33 = pPVar32 + 3;
                  goto LAB_00109760;
                }
                pPVar32 = pPVar32 + 4;
                lVar24 = lVar24 + -1;
              } while (1 < lVar24);
            }
            pPVar34 = pPVar34 + lVar14;
            lVar14 = ((long)pPVar34 - (long)pPVar32 >> 3) * -0x7d05f417d05f417d;
            if (lVar14 == 1) {
LAB_00109737:
              bVar7 = operator==(pQVar37,&pPVar32->notify);
              pPVar33 = pPVar32;
              if (!bVar7) {
                pPVar33 = pPVar34;
              }
            }
            else if (lVar14 == 2) {
LAB_00109703:
              bVar7 = operator==(pQVar37,&pPVar32->notify);
              pPVar33 = pPVar32;
              if (!bVar7) {
                pPVar32 = pPVar32 + 1;
                goto LAB_00109737;
              }
            }
            else {
              pPVar33 = pPVar34;
              if ((lVar14 == 3) &&
                 (bVar7 = operator==(pQVar37,&pPVar32->notify), pPVar33 = pPVar32, !bVar7)) {
                pPVar32 = pPVar32 + 1;
                goto LAB_00109703;
              }
            }
LAB_00109760:
            pcVar39 = (pQVar37->d).ptr;
            if (pcVar39 == (char *)0x0) {
              pcVar39 = (char *)&QByteArray::_empty;
            }
            fprintf((FILE *)this->out,
                    "template<typename T> using has_nullary_%s = decltype(std::declval<T>().%s());\n"
                    ,pcVar39);
            pcVar39 = (pQVar37->d).ptr;
            if (pcVar39 == (char *)0x0) {
              pcVar39 = (char *)&QByteArray::_empty;
            }
            pcVar21 = (pPVar33->type).d.ptr;
            if (pcVar21 == (char *)0x0) {
              pcVar21 = (char *)&QByteArray::_empty;
            }
            fprintf((FILE *)this->out,
                    "template<typename T> using has_unary_%s = decltype(std::declval<T>().%s(std::declval<%s>()));\n"
                    ,pcVar39,pcVar39,pcVar21);
            pcVar39 = (pQVar37->d).ptr;
            if (pcVar39 == (char *)0x0) {
              pcVar39 = (char *)&QByteArray::_empty;
            }
            pcVar21 = (this->cdef->super_BaseDef).qualified.d.ptr;
            if (pcVar21 == (char *)0x0) {
              pcVar21 = (char *)&QByteArray::_empty;
            }
            fprintf((FILE *)this->out,
                    "static_assert(qxp::is_detected_v<has_nullary_%s, %s> || qxp::is_detected_v<has_unary_%s, %s>,\n              \"NOTIFY signal %s does not exist in class (or is private in its parent)\");\n"
                    ,pcVar39,pcVar21,pcVar39,pcVar21,pcVar39);
            pQVar37 = pQVar37 + 1;
          } while (pQVar37 != pQVar23);
        }
        fwrite("}\n",2,1,(FILE *)this->out);
      }
    }
  }
  QMultiHash<QByteArray,_QByteArray>::~QMultiHash(&local_118);
  QArrayDataPointer<QByteArray>::~QArrayDataPointer((QArrayDataPointer<QByteArray> *)&def);
  if (local_168 != (QArrayData *)0x0) {
    LOCK();
    (local_168->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_168->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_168->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_168,1,0x10);
    }
  }
  if (qualifiedClassNameIdentifier.d.d != (Data *)0x0) {
    LOCK();
    ((qualifiedClassNameIdentifier.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
    _M_i = ((qualifiedClassNameIdentifier.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((qualifiedClassNameIdentifier.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(qualifiedClassNameIdentifier.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Generator::generateCode()
{
    bool isQObject = (cdef->classname == "QObject");
    bool isConstructible = !cdef->constructorList.isEmpty();

    // filter out undeclared enumerators and sets
    {
        QList<EnumDef> enumList;
        for (EnumDef def : std::as_const(cdef->enumList)) {
            if (cdef->enumDeclarations.contains(def.name)) {
                enumList += def;
            }
            def.enumName = def.name;
            QByteArray alias = cdef->flagAliases.value(def.name);
            if (cdef->enumDeclarations.contains(alias)) {
                def.name = alias;
                def.flags |= cdef->enumDeclarations[alias];
                enumList += def;
            }
        }
        cdef->enumList = enumList;
    }

//
// Register all strings used in data section
//
    strreg(cdef->qualified);
    registerClassInfoStrings();
    registerFunctionStrings(cdef->signalList);
    registerFunctionStrings(cdef->slotList);
    registerFunctionStrings(cdef->methodList);
    registerFunctionStrings(cdef->constructorList);
    registerByteArrayVector(cdef->nonClassSignalList);
    registerPropertyStrings();
    registerEnumStrings();

    const bool requireCompleteness = requireCompleteTypes || cdef->requireCompleteMethodTypes;
    bool hasStaticMetaCall =
            (cdef->hasQObject || !cdef->methodList.isEmpty()
             || !cdef->propertyList.isEmpty() || !cdef->constructorList.isEmpty());
    if (parser->activeQtMode)
        hasStaticMetaCall = false;

    const QByteArray qualifiedClassNameIdentifier = generateQualifiedClassNameIdentifier(cdef->qualified);

    // type name for the Q_OJBECT/GADGET itself, void for namespaces
    const char *ownType = !cdef->hasQNamespace ? cdef->classname.data() : "void";

    // ensure the qt_meta_tag_XXXX_t type is local
    fprintf(out, "namespace {\n"
                 "struct qt_meta_tag_%s_t {};\n"
                 "} // unnamed namespace\n\n",
            qualifiedClassNameIdentifier.constData());

//
// build the strings, data, and metatype arrays
//

    // We define a method inside the context of the class or namespace we're
    // creating the meta object for, so we get access to everything it has
    // access to and with the same contexts (for example, member enums and
    // types).
    fprintf(out, "template <> constexpr inline auto %s::qt_create_metaobjectdata<qt_meta_tag_%s_t>()\n"
                 "{\n"
                 "    namespace QMC = QtMocConstants;\n",
            cdef->qualified.constData(), qualifiedClassNameIdentifier.constData());

    fprintf(out, "    QtMocHelpers::StringRefStorage qt_stringData {");
    addStrings(strings);
    fprintf(out, "\n    };\n\n");

    fprintf(out, "    QtMocHelpers::UintData qt_methods {\n");

    // Build signals array first, otherwise the signal indices would be wrong
    addFunctions(cdef->signalList, "Signal");
    addFunctions(cdef->slotList, "Slot");
    addFunctions(cdef->methodList, "Method");
    fprintf(out, "    };\n"
                 "    QtMocHelpers::UintData qt_properties {\n");
    addProperties();
    fprintf(out, "    };\n"
                 "    QtMocHelpers::UintData qt_enums {\n");
    addEnums();
    fprintf(out, "    };\n");

    const char *uintDataParams = "";
    if (isConstructible || !cdef->classInfoList.isEmpty()) {
        if (isConstructible) {
            fprintf(out, "    using Constructor = QtMocHelpers::NoType;\n"
                         "    QtMocHelpers::UintData qt_constructors {\n");
            addFunctions(cdef->constructorList, "Constructor");
            fprintf(out, "    };\n");
        } else {
            fputs("    QtMocHelpers::UintData qt_constructors {};\n", out);
        }

        uintDataParams = ", qt_constructors";
        if (!cdef->classInfoList.isEmpty()) {
            fprintf(out, "    QtMocHelpers::ClassInfos qt_classinfo({\n");
            addClassInfos();
            fprintf(out, "    });\n");
            uintDataParams = ", qt_constructors, qt_classinfo";
        }
    }

    const char *metaObjectFlags = "QMC::MetaObjectFlag{}";
    if (cdef->hasQGadget || cdef->hasQNamespace) {
        // Ideally, all the classes could have that flag. But this broke
        // classes generated by qdbusxml2cpp which generate code that require
        // that we call qt_metacall for properties.
        metaObjectFlags = "QMC::PropertyAccessInStaticMetaCall";
    }
    {
        QByteArray tagType = QByteArrayLiteral("void");
        if (!requireCompleteness)
            tagType = "qt_meta_tag_" + qualifiedClassNameIdentifier +  "_t";
        fprintf(out, "    return QtMocHelpers::metaObjectData<%s, %s>(%s, qt_stringData,\n"
                     "            qt_methods, qt_properties, qt_enums%s);\n"
                     "}\n",
                ownType, tagType.constData(), metaObjectFlags, uintDataParams);
    }

    QByteArray metaVarNameSuffix;
    if (cdef->hasQNamespace) {
        // Q_NAMESPACE does not define the variables, so we have to. Declare as
        // plain, file-scope static variables (not templates).
        metaVarNameSuffix = '_' + qualifiedClassNameIdentifier;
        const char *n = metaVarNameSuffix.constData();
        fprintf(out, R"(
static constexpr auto qt_staticMetaObjectContent%s =
    %s::qt_create_metaobjectdata<qt_meta_tag%s_t>();
static constexpr auto qt_staticMetaObjectStaticContent%s =
    qt_staticMetaObjectContent%s.staticData;
static constexpr auto qt_staticMetaObjectRelocatingContent%s =
    qt_staticMetaObjectContent%s.relocatingData;

)",
                n, cdef->qualified.constData(), n,
                n, n,
                n, n);
    } else {
        // Q_OBJECT and Q_GADGET do declare them, so we just use the templates.
        metaVarNameSuffix = "<qt_meta_tag_" + qualifiedClassNameIdentifier + "_t>";
    }

//
// Build extra array
//
    QList<QByteArray> extraList;
    QMultiHash<QByteArray, QByteArray> knownExtraMetaObject(knownGadgets);
    knownExtraMetaObject.unite(knownQObjectClasses);

    for (const PropertyDef &p : std::as_const(cdef->propertyList)) {
        if (isBuiltinType(p.type))
            continue;

        if (p.type.contains('*') || p.type.contains('<') || p.type.contains('>'))
            continue;

        const qsizetype s = p.type.lastIndexOf("::");
        if (s <= 0)
            continue;

        QByteArray unqualifiedScope = p.type.left(s);

        // The scope may be a namespace for example, so it's only safe to include scopes that are known QObjects (QTBUG-2151)
        QMultiHash<QByteArray, QByteArray>::ConstIterator scopeIt;

        QByteArray thisScope = cdef->qualified;
        do {
            const qsizetype s = thisScope.lastIndexOf("::");
            thisScope = thisScope.left(s);
            QByteArray currentScope = thisScope.isEmpty() ? unqualifiedScope : thisScope + "::" + unqualifiedScope;
            scopeIt = knownExtraMetaObject.constFind(currentScope);
        } while (!thisScope.isEmpty() && scopeIt == knownExtraMetaObject.constEnd());

        if (scopeIt == knownExtraMetaObject.constEnd())
            continue;

        const QByteArray &scope = *scopeIt;

        if (scope == "Qt")
            continue;
        if (qualifiedNameEquals(cdef->qualified, scope))
            continue;

        if (!extraList.contains(scope))
            extraList += scope;
    }

    // QTBUG-20639 - Accept non-local enums for QML signal/slot parameters.
    // Look for any scoped enum declarations, and add those to the list
    // of extra/related metaobjects for this object.
    for (auto it = cdef->enumDeclarations.keyBegin(),
         end = cdef->enumDeclarations.keyEnd(); it != end; ++it) {
        const QByteArray &enumKey = *it;
        const qsizetype s = enumKey.lastIndexOf("::");
        if (s > 0) {
            QByteArray scope = enumKey.left(s);
            if (scope != "Qt" && !qualifiedNameEquals(cdef->qualified, scope) && !extraList.contains(scope))
                extraList += scope;
        }
    }

//
// Generate meta object link to parent meta objects
//

    if (!extraList.isEmpty()) {
        fprintf(out, "Q_CONSTINIT static const QMetaObject::SuperData qt_meta_extradata_%s[] = {\n",
                qualifiedClassNameIdentifier.constData());
        for (const QByteArray &ba : std::as_const(extraList))
            fprintf(out, "    QMetaObject::SuperData::link<%s::staticMetaObject>(),\n", ba.constData());

        fprintf(out, "    nullptr\n};\n\n");
    }

//
// Finally create and initialize the static meta object
//
    fprintf(out, "Q_CONSTINIT const QMetaObject %s::staticMetaObject = { {\n",
            cdef->qualified.constData());

    if (isQObject)
        fprintf(out, "    nullptr,\n");
    else if (cdef->superclassList.size() && !cdef->hasQGadget && !cdef->hasQNamespace) // for qobject, we know the super class must have a static metaobject
        fprintf(out, "    QMetaObject::SuperData::link<%s::staticMetaObject>(),\n", purestSuperClass.constData());
    else if (cdef->superclassList.size()) // for gadgets we need to query at compile time for it
        fprintf(out, "    QtPrivate::MetaObjectForType<%s>::value,\n", purestSuperClass.constData());
    else
        fprintf(out, "    nullptr,\n");
    fprintf(out, "    qt_staticMetaObjectStaticContent%s.stringdata,\n"
            "    qt_staticMetaObjectStaticContent%s.data,\n",
            metaVarNameSuffix.constData(),
            metaVarNameSuffix.constData());
    if (hasStaticMetaCall)
        fprintf(out, "    qt_static_metacall,\n");
    else
        fprintf(out, "    nullptr,\n");

    if (extraList.isEmpty())
        fprintf(out, "    nullptr,\n");
    else
        fprintf(out, "    qt_meta_extradata_%s,\n", qualifiedClassNameIdentifier.constData());

    fprintf(out, "    qt_staticMetaObjectRelocatingContent%s.metaTypes,\n",
            metaVarNameSuffix.constData());

    fprintf(out, "    nullptr\n} };\n\n");

//
// Generate internal qt_static_metacall() function
//
    if (hasStaticMetaCall)
        generateStaticMetacall();

    if (!cdef->hasQObject)
        return;

    fprintf(out, "\nconst QMetaObject *%s::metaObject() const\n{\n"
                 "    return QObject::d_ptr->metaObject ? QObject::d_ptr->dynamicMetaObject() : &staticMetaObject;\n"
                 "}\n",
            cdef->qualified.constData());

//
// Generate smart cast function
//
    fprintf(out, "\nvoid *%s::qt_metacast(const char *_clname)\n{\n", cdef->qualified.constData());
    fprintf(out, "    if (!_clname) return nullptr;\n");
    fprintf(out, "    if (!strcmp(_clname, qt_staticMetaObjectStaticContent<qt_meta_tag_%s_t>.strings))\n"
                  "        return static_cast<void*>(this);\n",
            qualifiedClassNameIdentifier.constData());

    // for all superclasses but the first one
    if (cdef->superclassList.size() > 1) {
        auto it = cdef->superclassList.cbegin() + 1;
        const auto end = cdef->superclassList.cend();
        for (; it != end; ++it) {
            if (it->access == FunctionDef::Private)
                continue;
            const char *cname = it->classname.constData();
            fprintf(out, "    if (!strcmp(_clname, \"%s\"))\n        return static_cast< %s*>(this);\n",
                    cname, cname);
        }
    }

    for (const QList<ClassDef::Interface> &iface : std::as_const(cdef->interfaceList)) {
        for (qsizetype j = 0; j < iface.size(); ++j) {
            fprintf(out, "    if (!strcmp(_clname, %s))\n        return ", iface.at(j).interfaceId.constData());
            for (qsizetype k = j; k >= 0; --k)
                fprintf(out, "static_cast< %s*>(", iface.at(k).className.constData());
            fprintf(out, "this%s;\n", QByteArray(j + 1, ')').constData());
        }
    }
    if (!purestSuperClass.isEmpty() && !isQObject) {
        QByteArray superClass = purestSuperClass;
        fprintf(out, "    return %s::qt_metacast(_clname);\n", superClass.constData());
    } else {
        fprintf(out, "    return nullptr;\n");
    }
    fprintf(out, "}\n");

    if (parser->activeQtMode)
        return;

//
// Generate internal qt_metacall()  function
//
    generateMetacall();

//
// Generate internal signal functions
//
    for (int signalindex = 0; signalindex < int(cdef->signalList.size()); ++signalindex)
        generateSignal(&cdef->signalList.at(signalindex), signalindex);

//
// Generate plugin meta data
//
    generatePluginMetaData();

//
// Generate function to make sure the non-class signals exist in the parent classes
//
    if (!cdef->nonClassSignalList.isEmpty()) {
        fprintf(out, "namespace CheckNotifySignalValidity_%s {\n", qualifiedClassNameIdentifier.constData());
        for (const QByteArray &nonClassSignal : std::as_const(cdef->nonClassSignalList)) {
            const auto propertyIt = std::find_if(cdef->propertyList.constBegin(),
                                   cdef->propertyList.constEnd(),
                                   [&nonClassSignal](const PropertyDef &p) {
                return nonClassSignal == p.notify;
            });
            // must find something, otherwise checkProperties wouldn't have inserted an entry into nonClassSignalList
            Q_ASSERT(propertyIt != cdef->propertyList.constEnd());
            fprintf(out, "template<typename T> using has_nullary_%s = decltype(std::declval<T>().%s());\n",
                    nonClassSignal.constData(),
                    nonClassSignal.constData());
            const auto &propertyType = propertyIt->type;
            fprintf(out, "template<typename T> using has_unary_%s = decltype(std::declval<T>().%s(std::declval<%s>()));\n",
                    nonClassSignal.constData(),
                    nonClassSignal.constData(),
                    propertyType.constData());
            fprintf(out, "static_assert(qxp::is_detected_v<has_nullary_%s, %s> || qxp::is_detected_v<has_unary_%s, %s>,\n"
                         "              \"NOTIFY signal %s does not exist in class (or is private in its parent)\");\n",
                    nonClassSignal.constData(), cdef->qualified.constData(),
                    nonClassSignal.constData(), cdef->qualified.constData(),
                    nonClassSignal.constData());
        }
        fprintf(out, "}\n");
    }
}